

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRefactor.c
# Opt level: O2

int Abc_NtkRefactor(Abc_Ntk_t *pNtk,int nNodeSizeMax,int nConeSizeMax,int fUpdateLevel,int fUseZeros
                   ,int fUseDcs,int fVerbose)

{
  int nItemsTotal;
  int iVar1;
  abctime aVar2;
  Abc_ManCut_t *p;
  Abc_ManRef_t *p_00;
  Vec_Ptr_t *pVVar3;
  ProgressBar *p_01;
  Abc_Obj_t *pRoot;
  abctime aVar4;
  abctime aVar5;
  Dec_Graph_t *pGraph;
  int fUseDcs_00;
  char *__assertion;
  int i;
  int in_stack_ffffffffffffff88;
  
  iVar1 = fUseDcs;
  aVar2 = Abc_Clock();
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRefactor.c"
                  ,0x152,"int Abc_NtkRefactor(Abc_Ntk_t *, int, int, int, int, int, int)");
  }
  Abc_AigCleanup((Abc_Aig_t *)pNtk->pManFunc);
  p = Abc_NtkManCutStart(nNodeSizeMax,nConeSizeMax,2,1000);
  p_00 = Abc_NtkManRefStart(nNodeSizeMax,nConeSizeMax,fUseDcs_00,fVerbose);
  pVVar3 = Abc_NtkManCutReadCutLarge(p);
  p_00->vLeaves = pVVar3;
  if (fUpdateLevel != 0) {
    Abc_NtkStartReverseLevels(pNtk,0);
  }
  p_00->nNodesBeg = pNtk->nObjCounts[7];
  nItemsTotal = pNtk->vObjs->nSize;
  p_01 = Extra_ProgressBarStart(_stdout,nItemsTotal);
  for (i = 0; i < pNtk->vObjs->nSize; i = i + 1) {
    pRoot = (Abc_Obj_t *)Vec_PtrEntry(pNtk->vObjs,i);
    if ((pRoot != (Abc_Obj_t *)0x0) && ((*(uint *)&pRoot->field_0x14 & 0xf) == 7)) {
      if ((p_01 == (ProgressBar *)0x0) || (p_01->nItemsNext <= i)) {
        Extra_ProgressBarUpdate_int(p_01,i,(char *)0x0);
      }
      if (((ulong)pRoot & 1) != 0) {
        __assertion = "!Abc_ObjIsComplement(pNode)";
LAB_002b2eea:
        __assert_fail(__assertion,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                      ,399,"int Abc_AigNodeIsAnd(Abc_Obj_t *)");
      }
      if (pRoot->pNtk->ntkType != ABC_NTK_STRASH) {
        __assertion = "Abc_NtkIsStrash(pNode->pNtk)";
        goto LAB_002b2eea;
      }
      if ((pRoot->vFanins).nSize != 2) {
        __assert_fail("Abc_AigNodeIsAnd(pNode)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                      ,0x193,"int Abc_NodeIsPersistant(Abc_Obj_t *)");
      }
      if (((pRoot->field_0x15 & 2) == 0) && ((pRoot->vFanouts).nSize < 0x3e9)) {
        if (nItemsTotal <= i) break;
        aVar4 = Abc_Clock();
        pVVar3 = Abc_NodeFindCut(p,pRoot,fUseDcs);
        aVar5 = Abc_Clock();
        p_00->timeCut = p_00->timeCut + (aVar5 - aVar4);
        aVar4 = Abc_Clock();
        pGraph = Abc_NodeRefactor(p_00,pRoot,pVVar3,fUpdateLevel,fUseZeros,iVar1,
                                  in_stack_ffffffffffffff88);
        aVar5 = Abc_Clock();
        p_00->timeRes = p_00->timeRes + (aVar5 - aVar4);
        if (pGraph != (Dec_Graph_t *)0x0) {
          aVar4 = Abc_Clock();
          Dec_GraphUpdateNetwork(pRoot,pGraph,fUpdateLevel,p_00->nLastGain);
          aVar5 = Abc_Clock();
          p_00->timeNtk = p_00->timeNtk + (aVar5 - aVar4);
          Dec_GraphFree(pGraph);
        }
      }
    }
  }
  Extra_ProgressBarStop(p_01);
  aVar4 = Abc_Clock();
  p_00->timeTotal = aVar4 - aVar2;
  p_00->nNodesEnd = pNtk->nObjCounts[7];
  if (fVerbose != 0) {
    Abc_NtkManRefPrintStats(p_00);
  }
  Abc_NtkManCutStop(p);
  Abc_NtkManRefStop(p_00);
  Abc_NtkReassignIds(pNtk);
  if (fUpdateLevel == 0) {
    Abc_NtkLevel(pNtk);
  }
  else {
    Abc_NtkStopReverseLevels(pNtk);
  }
  iVar1 = Abc_NtkCheck(pNtk);
  if (iVar1 == 0) {
    puts("Abc_NtkRefactor: The network check has failed.");
  }
  return (uint)(iVar1 != 0);
}

Assistant:

int Abc_NtkRefactor( Abc_Ntk_t * pNtk, int nNodeSizeMax, int nConeSizeMax, int fUpdateLevel, int fUseZeros, int fUseDcs, int fVerbose )
{
    extern void           Dec_GraphUpdateNetwork( Abc_Obj_t * pRoot, Dec_Graph_t * pGraph, int fUpdateLevel, int nGain );
    ProgressBar * pProgress;
    Abc_ManRef_t * pManRef;
    Abc_ManCut_t * pManCut;
    Dec_Graph_t * pFForm;
    Vec_Ptr_t * vFanins;
    Abc_Obj_t * pNode;
    abctime clk, clkStart = Abc_Clock();
    int i, nNodes;

    assert( Abc_NtkIsStrash(pNtk) );
    // cleanup the AIG
    Abc_AigCleanup((Abc_Aig_t *)pNtk->pManFunc);
    // start the managers
    pManCut = Abc_NtkManCutStart( nNodeSizeMax, nConeSizeMax, 2, 1000 );
    pManRef = Abc_NtkManRefStart( nNodeSizeMax, nConeSizeMax, fUseDcs, fVerbose );
    pManRef->vLeaves   = Abc_NtkManCutReadCutLarge( pManCut );
    // compute the reverse levels if level update is requested
    if ( fUpdateLevel )
        Abc_NtkStartReverseLevels( pNtk, 0 );

    // resynthesize each node once
    pManRef->nNodesBeg = Abc_NtkNodeNum(pNtk);
    nNodes = Abc_NtkObjNumMax(pNtk);
    pProgress = Extra_ProgressBarStart( stdout, nNodes );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        Extra_ProgressBarUpdate( pProgress, i, NULL );
        // skip the constant node
//        if ( Abc_NodeIsConst(pNode) )
//            continue;
        // skip persistant nodes
        if ( Abc_NodeIsPersistant(pNode) )
            continue;
        // skip the nodes with many fanouts
        if ( Abc_ObjFanoutNum(pNode) > 1000 )
            continue;
        // stop if all nodes have been tried once
        if ( i >= nNodes )
            break;
        // compute a reconvergence-driven cut
clk = Abc_Clock();
        vFanins = Abc_NodeFindCut( pManCut, pNode, fUseDcs );
pManRef->timeCut += Abc_Clock() - clk;
        // evaluate this cut
clk = Abc_Clock();
        pFForm = Abc_NodeRefactor( pManRef, pNode, vFanins, fUpdateLevel, fUseZeros, fUseDcs, fVerbose );
pManRef->timeRes += Abc_Clock() - clk;
        if ( pFForm == NULL )
            continue;
        // acceptable replacement found, update the graph
clk = Abc_Clock();
        Dec_GraphUpdateNetwork( pNode, pFForm, fUpdateLevel, pManRef->nLastGain );
pManRef->timeNtk += Abc_Clock() - clk;
        Dec_GraphFree( pFForm );
    }
    Extra_ProgressBarStop( pProgress );
pManRef->timeTotal = Abc_Clock() - clkStart;
    pManRef->nNodesEnd = Abc_NtkNodeNum(pNtk);

    // print statistics of the manager
    if ( fVerbose )
        Abc_NtkManRefPrintStats( pManRef );
    // delete the managers
    Abc_NtkManCutStop( pManCut );
    Abc_NtkManRefStop( pManRef );
    // put the nodes into the DFS order and reassign their IDs
    Abc_NtkReassignIds( pNtk );
//    Abc_AigCheckFaninOrder( pNtk->pManFunc );
    // fix the levels
    if ( fUpdateLevel )
        Abc_NtkStopReverseLevels( pNtk );
    else
        Abc_NtkLevel( pNtk );
    // check
    if ( !Abc_NtkCheck( pNtk ) )
    {
        printf( "Abc_NtkRefactor: The network check has failed.\n" );
        return 0;
    }
    return 1;
}